

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_15x15(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp27;
  JLONG tmp26;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp16;
  JLONG tmp15;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_2d8 [16];
  int local_298 [8];
  int local_278 [8];
  int local_258 [8];
  int local_238 [8];
  int local_218 [8];
  int local_1f8 [8];
  int local_1d8 [8];
  int local_1b8 [8];
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [11];
  int local_ec;
  long local_e8;
  int *local_d8;
  short *local_d0;
  short *local_c8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_e8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_d0 = *(short **)(in_RSI + 0x58);
  local_d8 = local_2d8;
  local_c8 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_ec = 0; local_ec < 8; local_ec = local_ec + 1) {
    lVar1 = (long)((int)*local_c8 * (int)*local_d0) * 0x2000 + 0x400;
    lVar2 = (long)((int)local_c8[0x10] * (int)local_d0[0x10]);
    lVar3 = (long)((int)local_c8[0x30] * (int)local_d0[0x30]);
    lVar4 = lVar1 + lVar3 * -0xdfc;
    lVar5 = lVar1 + lVar3 * 0x249d;
    lVar1 = lVar1 + lVar3 * -0x2d42;
    lVar3 = lVar2 - (int)local_c8[0x20] * (int)local_d0[0x20];
    lVar6 = lVar2 + (int)local_c8[0x20] * (int)local_d0[0x20];
    local_68 = lVar5 + lVar6 * 0x2ace + lVar3 * 0x176;
    local_80 = lVar4 + lVar6 * -0x2ace + lVar3 * 0x176 + lVar2 * 0x2e13;
    local_90 = lVar5 + lVar6 * -0x1182 + lVar3 * -0xcc7;
    local_98 = lVar4 + lVar6 * 0x1182 + lVar3 * -0xcc7 + lVar2 * -0x2e13;
    local_70 = lVar4 + lVar6 * 0x194c + lVar3 * 0xb50;
    local_88 = lVar5 + lVar6 * -0x194c + lVar3 * 0xb50;
    local_78 = lVar1 + lVar3 * 0x16a0;
    local_a0 = lVar1 + lVar3 * -0x16a0 + lVar3 * -0x16a0;
    lVar2 = (long)((int)local_c8[8] * (int)local_d0[8]);
    lVar3 = (long)((int)local_c8[0x18] * (int)local_d0[0x18]);
    lVar4 = (long)((int)local_c8[0x28] * (int)local_d0[0x28]);
    lVar5 = (long)((int)local_c8[0x38] * (int)local_d0[0x38]);
    local_50 = (lVar2 + (lVar3 - lVar5)) * 0x1a9a;
    local_38 = local_50 + lVar2 * 0x1071;
    local_50 = local_50 + (lVar3 - lVar5) * -0x45a4;
    lVar1 = lVar4 * 0x2731 + (lVar2 - lVar5) * 0x2d02;
    local_30 = lVar1 + lVar5 * 0x4ea3 + lVar3 * 0x2b0a;
    local_60 = lVar1 + lVar2 * -0x2399 + lVar3 * -0x1a9a;
    local_40 = (lVar2 - lVar5) * 0x2731 + lVar4 * -0x2731;
    lVar1 = (lVar2 + lVar5) * 0x1268;
    local_48 = lVar1 + lVar2 * 0xf39 + lVar4 * -0x2731 + lVar3 * -0x1a9a;
    local_58 = lVar1 + lVar5 * -0x1bd1 + lVar4 * 0x2731 + lVar3 * -0x2b0a;
    *local_d8 = (int)(local_68 + local_30 >> 0xb);
    local_d8[0x70] = (int)(local_68 - local_30 >> 0xb);
    local_d8[8] = (int)(local_70 + local_38 >> 0xb);
    local_d8[0x68] = (int)(local_70 - local_38 >> 0xb);
    local_d8[0x10] = (int)(local_78 + local_40 >> 0xb);
    local_d8[0x60] = (int)(local_78 - local_40 >> 0xb);
    local_d8[0x18] = (int)(local_80 + local_48 >> 0xb);
    local_d8[0x58] = (int)(local_80 - local_48 >> 0xb);
    local_d8[0x20] = (int)(local_88 + local_50 >> 0xb);
    local_d8[0x50] = (int)(local_88 - local_50 >> 0xb);
    local_d8[0x28] = (int)(local_90 + local_58 >> 0xb);
    local_d8[0x48] = (int)(local_90 - local_58 >> 0xb);
    local_d8[0x30] = (int)(local_98 + local_60 >> 0xb);
    local_d8[0x40] = (int)(local_98 - local_60 >> 0xb);
    local_d8[0x38] = (int)(local_a0 >> 0xb);
    local_c8 = local_c8 + 1;
    local_d0 = local_d0 + 1;
    local_d8 = local_d8 + 1;
  }
  local_d8 = local_2d8;
  for (local_ec = 0; local_ec < 0xf; local_ec = local_ec + 1) {
    puVar7 = (undefined1 *)(*(long *)(local_20 + (long)local_ec * 8) + (ulong)local_24);
    lVar1 = ((long)*local_d8 + 0x10) * 0x2000;
    lVar2 = (long)local_d8[2];
    lVar3 = (long)local_d8[6];
    lVar4 = lVar1 + lVar3 * -0xdfc;
    lVar5 = lVar1 + lVar3 * 0x249d;
    lVar1 = lVar1 + lVar3 * -0x2d42;
    lVar3 = lVar2 - local_d8[4];
    lVar6 = lVar2 + local_d8[4];
    lVar8 = lVar5 + lVar6 * 0x2ace + lVar3 * 0x176;
    lVar9 = lVar4 + lVar6 * -0x2ace + lVar3 * 0x176 + lVar2 * 0x2e13;
    lVar10 = lVar5 + lVar6 * -0x1182 + lVar3 * -0xcc7;
    lVar2 = lVar4 + lVar6 * 0x1182 + lVar3 * -0xcc7 + lVar2 * -0x2e13;
    lVar4 = lVar4 + lVar6 * 0x194c + lVar3 * 0xb50;
    lVar5 = lVar5 + lVar6 * -0x194c + lVar3 * 0xb50;
    lVar6 = lVar1 + lVar3 * 0x16a0;
    lVar11 = (long)local_d8[1];
    lVar12 = (long)local_d8[3];
    lVar13 = (long)local_d8[5];
    lVar14 = (long)local_d8[7];
    lVar15 = (lVar11 + (lVar12 - lVar14)) * 0x1a9a;
    lVar16 = lVar15 + lVar11 * 0x1071;
    lVar15 = lVar15 + (lVar12 - lVar14) * -0x45a4;
    lVar17 = lVar13 * 0x2731 + (lVar11 - lVar14) * 0x2d02;
    lVar18 = lVar17 + lVar14 * 0x4ea3 + lVar12 * 0x2b0a;
    lVar17 = lVar17 + lVar11 * -0x2399 + lVar12 * -0x1a9a;
    lVar19 = (lVar11 - lVar14) * 0x2731 + lVar13 * -0x2731;
    lVar20 = (lVar11 + lVar14) * 0x1268;
    lVar11 = lVar20 + lVar11 * 0xf39 + lVar13 * -0x2731 + lVar12 * -0x1a9a;
    lVar12 = lVar20 + lVar14 * -0x1bd1 + lVar13 * 0x2731 + lVar12 * -0x2b0a;
    *puVar7 = *(undefined1 *)(local_e8 + (int)((uint)(lVar8 + lVar18 >> 0x12) & 0x3ff));
    puVar7[0xe] = *(undefined1 *)(local_e8 + (int)((uint)(lVar8 - lVar18 >> 0x12) & 0x3ff));
    puVar7[1] = *(undefined1 *)(local_e8 + (int)((uint)(lVar4 + lVar16 >> 0x12) & 0x3ff));
    puVar7[0xd] = *(undefined1 *)(local_e8 + (int)((uint)(lVar4 - lVar16 >> 0x12) & 0x3ff));
    puVar7[2] = *(undefined1 *)(local_e8 + (int)((uint)(lVar6 + lVar19 >> 0x12) & 0x3ff));
    puVar7[0xc] = *(undefined1 *)(local_e8 + (int)((uint)(lVar6 - lVar19 >> 0x12) & 0x3ff));
    puVar7[3] = *(undefined1 *)(local_e8 + (int)((uint)(lVar9 + lVar11 >> 0x12) & 0x3ff));
    puVar7[0xb] = *(undefined1 *)(local_e8 + (int)((uint)(lVar9 - lVar11 >> 0x12) & 0x3ff));
    puVar7[4] = *(undefined1 *)(local_e8 + (int)((uint)(lVar5 + lVar15 >> 0x12) & 0x3ff));
    puVar7[10] = *(undefined1 *)(local_e8 + (int)((uint)(lVar5 - lVar15 >> 0x12) & 0x3ff));
    puVar7[5] = *(undefined1 *)(local_e8 + (int)((uint)(lVar10 + lVar12 >> 0x12) & 0x3ff));
    puVar7[9] = *(undefined1 *)(local_e8 + (int)((uint)(lVar10 - lVar12 >> 0x12) & 0x3ff));
    puVar7[6] = *(undefined1 *)(local_e8 + (int)((uint)(lVar2 + lVar17 >> 0x12) & 0x3ff));
    puVar7[8] = *(undefined1 *)(local_e8 + (int)((uint)(lVar2 - lVar17 >> 0x12) & 0x3ff));
    puVar7[7] = *(undefined1 *)
                 (local_e8 +
                 (int)((uint)(lVar1 + lVar3 * -0x16a0 + lVar3 * -0x16a0 >> 0x12) & 0x3ff));
    local_d8 = local_d8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_15x15(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 15];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= LEFT_SHIFT(tmp11 - tmp10, 1);     /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, -FIX(0.831253876));                /* -c9 */
    tmp15 = MULTIPLY(z2, -FIX(1.344997024));                /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 14] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp27, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 15 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 15; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[4];
    z4 = (JLONG)wsptr[6];

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= LEFT_SHIFT(tmp11 - tmp10, 1);     /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[5];
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = (JLONG)wsptr[7];

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, -FIX(0.831253876));                /* -c9 */
    tmp15 = MULTIPLY(z2, -FIX(1.344997024));                /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[14] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp27,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}